

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR lys_eval_iffeatures(ly_ctx *ctx,lysp_qname *iffeatures,ly_bool *enabled)

{
  LY_ERR LVar1;
  ulong uVar2;
  lysp_qname *qname;
  lysc_iffeature iff;
  lysc_iffeature local_68;
  lysf_ctx local_50;
  
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  *enabled = '\x01';
  if (iffeatures != (lysp_qname *)0x0) {
    qname = iffeatures;
    local_50.ctx = ctx;
    for (uVar2 = 0; uVar2 < *(ulong *)&iffeatures[-1].flags; uVar2 = uVar2 + 1) {
      local_68.expr = (uint8_t *)0x0;
      local_68.features = (lysp_feature **)0x0;
      LVar1 = lys_compile_iffeature(ctx,qname,&local_68);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      LVar1 = lysc_iffeature_value(&local_68);
      lysc_iffeature_free(&local_50,&local_68);
      if (LVar1 != LY_SUCCESS) {
        if (LVar1 == LY_ENOT) {
          *enabled = '\0';
          return LY_SUCCESS;
        }
        return LVar1;
      }
      qname = qname + 1;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_eval_iffeatures(const struct ly_ctx *ctx, const struct lysp_qname *iffeatures, ly_bool *enabled)
{
    LY_ERR ret;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_iffeature iff;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};

    /* enabled by default */
    *enabled = 1;

    if (!iffeatures) {
        return LY_SUCCESS;
    }

    /* evaluate all if-feature conditions or until an unsatisfied one is found */
    LY_ARRAY_FOR(iffeatures, u) {
        memset(&iff, 0, sizeof iff);
        LY_CHECK_RET(lys_compile_iffeature(ctx, &iffeatures[u], &iff));

        ret = lysc_iffeature_value(&iff);
        lysc_iffeature_free(&fctx, &iff);
        if (ret == LY_ENOT) {
            *enabled = 0;
            break;
        } else if (ret) {
            return ret;
        }
    }

    return LY_SUCCESS;
}